

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

void __thiscall
re2::PCRE::Init(PCRE *this,char *pattern,Option options,int match_limit,int stack_limit,
               bool report_errors)

{
  string *this_00;
  ostream *poVar1;
  pcre *ppVar2;
  LogMessage local_1b8;
  undefined1 local_35;
  allocator local_26;
  byte local_25;
  int local_24;
  int iStack_20;
  bool report_errors_local;
  int stack_limit_local;
  int match_limit_local;
  Option options_local;
  char *pattern_local;
  PCRE *this_local;
  
  local_25 = report_errors;
  local_24 = stack_limit;
  iStack_20 = match_limit;
  stack_limit_local = options;
  _match_limit_local = pattern;
  pattern_local = (char *)this;
  std::__cxx11::string::operator=((string *)this,pattern);
  this->options_ = stack_limit_local;
  this->match_limit_ = iStack_20;
  this->stack_limit_ = local_24;
  this->hit_limit_ = 0;
  this->error_ = (string *)empty_string_abi_cxx11_;
  this->report_errors_ = (bool)(local_25 & 1);
  this->re_full_ = (pcre *)0x0;
  this->re_partial_ = (pcre *)0x0;
  if ((stack_limit_local & 0xfffff7ffU) == 0) {
    ppVar2 = Compile(this,UNANCHORED);
    this->re_partial_ = ppVar2;
    if (this->re_partial_ != (pcre *)0x0) {
      ppVar2 = Compile(this,ANCHOR_BOTH);
      this->re_full_ = ppVar2;
    }
  }
  else {
    this_00 = (string *)operator_new(0x20);
    local_35 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"illegal regexp option",&local_26);
    local_35 = 0;
    this->error_ = (string *)this_00;
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",0x66,
               2);
    poVar1 = LogMessage::stream(&local_1b8);
    poVar1 = std::operator<<(poVar1,"Error compiling \'");
    poVar1 = std::operator<<(poVar1,_match_limit_local);
    std::operator<<(poVar1,"\': illegal regexp option");
    LogMessage::~LogMessage(&local_1b8);
  }
  return;
}

Assistant:

void PCRE::Init(const char* pattern, Option options, int match_limit,
              int stack_limit, bool report_errors) {
  pattern_ = pattern;
  options_ = options;
  match_limit_ = match_limit;
  stack_limit_ = stack_limit;
  hit_limit_ = false;
  error_ = &empty_string;
  report_errors_ = report_errors;
  re_full_ = NULL;
  re_partial_ = NULL;

  if (options & ~(EnabledCompileOptions | EnabledExecOptions)) {
    error_ = new string("illegal regexp option");
    PCREPORT(ERROR)
        << "Error compiling '" << pattern << "': illegal regexp option";
  } else {
    re_partial_ = Compile(UNANCHORED);
    if (re_partial_ != NULL) {
      re_full_ = Compile(ANCHOR_BOTH);
    }
  }
}